

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

_Bool ImGui::IsWindowFocused(ImGuiFocusedFlags flags)

{
  ImGuiWindow_conflict *window;
  ImGuiWindow_conflict *potential_parent;
  _Bool _Var1;
  
  window = GImGui->NavWindow;
  if (window == (ImGuiWindow_conflict *)0x0) {
    return false;
  }
  _Var1 = true;
  if ((flags & 4U) == 0) {
    potential_parent = GImGui->CurrentWindow;
    if (potential_parent == (ImGuiWindow_conflict *)0x0) {
      __assert_fail("cur_window",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x1ca7,"bool ImGui::IsWindowFocused(ImGuiFocusedFlags)");
    }
    if ((flags & 2U) != 0) {
      potential_parent = potential_parent->RootWindow;
      if ((flags & 8U) == 0) {
        potential_parent = potential_parent->RootWindowPopupTree;
      }
      if ((flags & 0x10U) != 0) {
        potential_parent = potential_parent->RootWindowDockTree;
      }
    }
    if ((flags & 1U) != 0) {
      _Var1 = IsWindowChildOf(window,potential_parent,(flags & 8U) == 0,
                              SUB41((flags & 0x10U) >> 4,0));
      return _Var1;
    }
    _Var1 = window == potential_parent;
  }
  return _Var1;
}

Assistant:

bool ImGui::IsWindowFocused(ImGuiFocusedFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* ref_window = g.NavWindow;
    ImGuiWindow* cur_window = g.CurrentWindow;

    if (ref_window == NULL)
        return false;
    if (flags & ImGuiFocusedFlags_AnyWindow)
        return true;

    IM_ASSERT(cur_window); // Not inside a Begin()/End()
    const bool popup_hierarchy = (flags & ImGuiFocusedFlags_NoPopupHierarchy) == 0;
    const bool dock_hierarchy = (flags & ImGuiFocusedFlags_DockHierarchy) != 0;
    if (flags & ImGuiHoveredFlags_RootWindow)
        cur_window = GetCombinedRootWindow(cur_window, popup_hierarchy, dock_hierarchy);

    if (flags & ImGuiHoveredFlags_ChildWindows)
        return IsWindowChildOf(ref_window, cur_window, popup_hierarchy, dock_hierarchy);
    else
        return (ref_window == cur_window);
}